

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::CanInitializeByZeroing
               (FieldDescriptor *field,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  bool bVar1;
  CppType CVar2;
  int iVar3;
  int32_t iVar4;
  uint32_t uVar5;
  EnumValueDescriptor *this;
  int64_t iVar6;
  uint64_t uVar7;
  float fVar8;
  double dVar9;
  MessageSCCAnalyzer *scc_analyzer_local;
  Options *options_local;
  FieldDescriptor *field_local;
  
  bVar1 = FieldDescriptor::is_repeated(field);
  if ((bVar1) || (bVar1 = FieldDescriptor::is_extension(field), bVar1)) {
    field_local._7_1_ = false;
  }
  else {
    CVar2 = FieldDescriptor::cpp_type(field);
    switch(CVar2) {
    case CPPTYPE_INT32:
      iVar4 = FieldDescriptor::default_value_int32(field);
      field_local._7_1_ = iVar4 == 0;
      break;
    case CPPTYPE_INT64:
      iVar6 = FieldDescriptor::default_value_int64(field);
      field_local._7_1_ = iVar6 == 0;
      break;
    case CPPTYPE_UINT32:
      uVar5 = FieldDescriptor::default_value_uint32(field);
      field_local._7_1_ = uVar5 == 0;
      break;
    case CPPTYPE_UINT64:
      uVar7 = FieldDescriptor::default_value_uint64(field);
      field_local._7_1_ = uVar7 == 0;
      break;
    case CPPTYPE_DOUBLE:
      dVar9 = FieldDescriptor::default_value_double(field);
      field_local._7_1_ = dVar9 == 0.0;
      break;
    case CPPTYPE_FLOAT:
      fVar8 = FieldDescriptor::default_value_float(field);
      field_local._7_1_ = fVar8 == 0.0;
      break;
    case CPPTYPE_BOOL:
      bVar1 = FieldDescriptor::default_value_bool(field);
      field_local._7_1_ = !bVar1;
      break;
    case CPPTYPE_ENUM:
      this = (EnumValueDescriptor *)google::protobuf::FieldDescriptor::default_value_enum();
      iVar3 = EnumValueDescriptor::number(this);
      field_local._7_1_ = iVar3 == 0;
      break;
    default:
      field_local._7_1_ = false;
      break;
    case CPPTYPE_MESSAGE:
      field_local._7_1_ = true;
    }
  }
  return field_local._7_1_;
}

Assistant:

bool CanInitializeByZeroing(const FieldDescriptor* field,
                            const Options& options,
                            MessageSCCAnalyzer* scc_analyzer) {
  static_assert(
      std::numeric_limits<float>::is_iec559 &&
          std::numeric_limits<double>::is_iec559,
      "proto / abseil requires iec559, which has zero initialized floats.");

  if (field->is_repeated() || field->is_extension()) return false;
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_ENUM:
      return field->default_value_enum()->number() == 0;
    case FieldDescriptor::CPPTYPE_INT32:
      return field->default_value_int32() == 0;
    case FieldDescriptor::CPPTYPE_INT64:
      return field->default_value_int64() == 0;
    case FieldDescriptor::CPPTYPE_UINT32:
      return field->default_value_uint32() == 0;
    case FieldDescriptor::CPPTYPE_UINT64:
      return field->default_value_uint64() == 0;
    case FieldDescriptor::CPPTYPE_FLOAT:
      return field->default_value_float() == 0;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return field->default_value_double() == 0;
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() == false;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return true;
    default:
      return false;
  }
}